

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_file_size(char *file,wchar_t line,char *pathname,long size)

{
  long in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  stat st;
  wchar_t r;
  int64_t filesize;
  stat sStack_c8;
  int local_34;
  long local_30;
  long local_28;
  char *local_20;
  wchar_t local_14;
  char *local_10;
  wchar_t local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  assertion_count(in_RDI,in_ESI);
  local_34 = lstat(local_20,&sStack_c8);
  local_30 = sStack_c8.st_size;
  if ((local_34 == 0) && (sStack_c8.st_size == local_28)) {
    local_4 = L'\x01';
  }
  else {
    failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"File %s has size %ld, expected %ld",
                  local_20,sStack_c8.st_size,local_28);
    failure_finish((void *)0x11dbd5);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_file_size(const char *file, int line, const char *pathname, long size)
{
	int64_t filesize;
	int r;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	{
		BY_HANDLE_FILE_INFORMATION bhfi;
		r = !my_GetFileInformationByName(pathname, &bhfi);
		filesize = ((int64_t)bhfi.nFileSizeHigh << 32) + bhfi.nFileSizeLow;
	}
#else
	{
		struct stat st;
		r = lstat(pathname, &st);
		filesize = st.st_size;
	}
#endif
	if (r == 0 && filesize == size)
			return (1);
	failure_start(file, line, "File %s has size %ld, expected %ld",
	    pathname, (long)filesize, (long)size);
	failure_finish(NULL);
	return (0);
}